

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O1

ObjectPtr __thiscall ICM::DefFunc::Lists::disp(Lists *this,DataList *dl)

{
  DataObject<(ICM::DefaultType)18> *this_00;
  T local_30;
  
  this_00 = (DataObject<(ICM::DefaultType)18> *)operator_new(0x10);
  std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::vector
            (&local_30.data,
             (vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)
             (*(dl->_data).super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             data);
  Objects::DataObject<(ICM::DefaultType)18>::DataObject(this_00,&local_30);
  *(DataObject<(ICM::DefaultType)18> **)this = this_00;
  if (local_30.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.data.
                          super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.data.
                          super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr disp(const DataList &dl) {
				return ObjectPtr(new Disperse(DisperseType(_disp(dl[0]->get<T_List>()))));
			}